

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.c
# Opt level: O0

void var_ht_put(VarHashTable *ht,VarHTItemKey key,Variable value)

{
  uint32_t uVar1;
  uint uVar2;
  VarHTItem *new_item_00;
  undefined8 uVar3;
  _Bool local_41;
  _Bool already_inside;
  VarHTItem *new_item;
  uint32_t index;
  VarHashTable *ht_local;
  Variable value_local;
  VarHTItemKey key_local;
  
  uVar3 = value._8_8_;
  uVar1 = var_hash(key);
  uVar2 = uVar1 & ht->cap - 1;
  new_item_00 = (VarHTItem *)malloc(0x28);
  new_item_00->next = (var_table_item_t *)0x0;
  (new_item_00->key).key_ident_string = key.key_ident_string;
  (new_item_00->key).ident_length = key.ident_length;
  (new_item_00->value).index = (int)value._0_8_;
  (new_item_00->value).scope = (int)((ulong)value._0_8_ >> 0x20);
  (new_item_00->value).frame_offset = (int)uVar3;
  (new_item_00->value).assignable = (_Bool)(char)((ulong)uVar3 >> 0x20);
  *(int3 *)&(new_item_00->value).field_0xd = (int3)((ulong)uVar3 >> 0x28);
  local_41 = false;
  if (ht->buckets[uVar2] == (VarHTItem *)0x0) {
    ht->buckets[uVar2] = new_item_00;
  }
  else {
    local_41 = insert(ht->buckets + uVar2,key,new_item_00);
  }
  if (local_41 == false) {
    ht->size = ht->size + 1;
  }
  if (ht->cap < ht->size) {
    resize(ht);
  }
  return;
}

Assistant:

void var_ht_put(VarHashTable *ht, VarHTItemKey key, Variable value) {
    uint32_t index = var_hash(key) & (ht->cap - 1);
    VarHTItem *new_item = malloc(sizeof(VarHTItem));
    new_item->next = NULL;
    new_item->key = key;
    new_item->value = value;

    bool already_inside = false;
    if (ht->buckets[index] == NULL) {
        ht->buckets[index] = new_item;
    } else {
        already_inside = insert(&ht->buckets[index], key, new_item);
    }

    if (!already_inside) {
        ++ht->size;
    }

    if (ht->size > ht->cap) {
        resize(ht);
    }
}